

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v8::detail::vformat_to<char8_t>
               (buffer<char8_t> *buf,basic_string_view<char8_t> fmt,
               basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
               args,locale_ref loc)

{
  char8_t *pend;
  char cVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out;
  _func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_ptr
  *p_Var2;
  undefined1 value [16];
  undefined1 value_00 [16];
  char8_t *pcVar3;
  char8_t *pbegin;
  size_t sVar4;
  type tVar5;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> it;
  ulong uVar6;
  float value_01;
  char *end;
  basic_format_specs<char8_t> specs;
  writer write;
  undefined8 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  default_arg_formatter<char8_t> local_98;
  undefined1 local_78 [32];
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_58;
  char8_t *local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  local_48;
  locale_ref local_40;
  parse_context local_38;
  
  local_98.args.field_1 = args.field_1;
  local_98.args.desc_ = args.desc_;
  local_78._16_8_ = fmt.size_;
  pbegin = fmt.data_;
  if ((((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
         *)local_78._16_8_ ==
        (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
         *)0x2) && (*pbegin == '{')) && (pbegin[1] == '}')) {
    if ((long)local_98.args.desc_ < 0) {
      if (((int)(type)args.desc_ < 1) ||
         (tVar5 = (local_98.args.field_1.args_)->type_, tVar5 == none_type)) goto LAB_00112aa7;
    }
    else {
      tVar5 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_00112aa7:
        ::fmt::v8::detail::throw_format_error("argument not found");
      }
    }
    out.container = *(buffer<char8_t> **)&(local_98.args.field_1.values_)->field_0;
    p_Var2 = ((local_98.args.field_1.values_)->field_0).custom.format;
    value_01 = SUB84(out.container,0);
    local_98.out.container = buf;
    local_98.loc.locale_ = loc.locale_;
    switch(tVar5) {
    case int_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_int,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,(int)value_01);
      break;
    case uint_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_unsigned_int,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,(uint)value_01);
      break;
    case long_long_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_long_long,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 (longlong)out.container);
      break;
    case ulong_long_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_unsigned_long_long,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 (unsigned_long_long)out.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff60;
      value._0_8_ = in_stack_ffffffffffffff58;
      value._10_6_ = in_stack_ffffffffffffff62;
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,___int128,_0>
                ((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff60;
      value_00._0_8_ = in_stack_ffffffffffffff58;
      value_00._10_6_ = in_stack_ffffffffffffff62;
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char8_t>::operator()(&local_98,(bool)((byte)out.container & 1));
      break;
    case char_type:
      sVar4 = buf->size_;
      uVar6 = sVar4 + 1;
      if (buf->capacity_ < uVar6) {
        (**buf->_vptr_buffer)(buf);
        sVar4 = buf->size_;
        uVar6 = sVar4 + 1;
      }
      buf->size_ = uVar6;
      buf->ptr_[sVar4] = (byte)out.container;
      break;
    case float_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_float,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,value_01);
      break;
    case double_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_double,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,(double)out.container)
      ;
      break;
    case last_numeric_type:
      specs.type = none;
      specs._9_2_ = 0;
      specs.fill.data_[0] = ' ';
      specs.fill.data_[1] = '\0';
      specs.fill.data_[2] = '\0';
      specs.fill.data_[3] = '\0';
      specs.fill.size_ = '\x01';
      specs.width = 0;
      specs.precision = -1;
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_long_double,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 ((local_98.args.field_1.values_)->field_0).long_double_value,specs,(locale_ref)0x0)
      ;
      break;
    case cstring_type:
      write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 (char8_t *)out.container);
      break;
    case string_type:
      copy_str_noinline<char8_t,char8_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                ((char8_t *)out.container,(char8_t *)(p_Var2 + (long)out.container),
                 (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf);
      break;
    case pointer_type:
      default_arg_formatter<char8_t>::operator()(&local_98,out.container);
      break;
    case custom_type:
      local_38.format_str_.data_ = (char8_t *)0x0;
      local_38.format_str_.size_ = 0;
      local_38.next_arg_id_ = 0;
      local_78._0_8_ = buf;
      local_78._8_8_ = local_98.args.desc_;
      local_78._16_8_ = local_98.args.field_1;
      local_78._24_8_ = loc.locale_;
      (*p_Var2)(out.container,&local_38,
                (basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
                 *)local_78);
      break;
    default:
      ::fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
                 ,0x820,"");
    }
  }
  else {
    local_78._24_8_ = local_78._24_8_ & 0xffffffff00000000;
    pend = pbegin + local_78._16_8_;
    local_78._8_8_ = pbegin;
    local_58.container = buf;
    local_50 = (char8_t *)local_98.args.desc_;
    local_48 = local_98.args.field_1;
    local_40.locale_ = loc.locale_;
    if ((long)local_78._16_8_ < 0x20) {
      if ((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
           *)local_78._16_8_ !=
          (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
           *)0x0) {
        end = pbegin;
        do {
          pcVar3 = end + 1;
          if (*end == '}') {
            if ((pcVar3 == pend) || (*pcVar3 != '}')) {
              ::fmt::v8::detail::throw_format_error("unmatched \'}\' in format string");
            }
            vformat_to<char8_t>::format_handler::on_text((format_handler *)local_78,pbegin,pcVar3);
            pcVar3 = end + 2;
            pbegin = pcVar3;
          }
          else if (*end == '{') {
            vformat_to<char8_t>::format_handler::on_text((format_handler *)local_78,pbegin,end);
            pcVar3 = parse_replacement_field<char8_t,fmt::v8::detail::vformat_to<char8_t>(fmt::v8::detail::buffer<char8_t>&,fmt::v8::basic_string_view<char8_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char8_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char8_t>::type>>>::type,fmt::v8::type_identity<char8_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                               (end,pend,(format_handler *)local_78);
            pbegin = pcVar3;
          }
          end = pcVar3;
        } while (pcVar3 != pend);
      }
      vformat_to<char8_t>::format_handler::on_text((format_handler *)local_78,pbegin,pend);
    }
    else {
      local_98.out.container = (buffer<char8_t> *)local_78;
      do {
        cVar1 = *pbegin;
        pcVar3 = pbegin;
        while (cVar1 != '{') {
          pcVar3 = pcVar3 + 1;
          if (pcVar3 == pend) {
            parse_format_string<false,_char8_t,_format_handler>::writer::operator()
                      ((writer *)&local_98,pbegin,pend);
            return;
          }
          cVar1 = *pcVar3;
        }
        parse_format_string<false,_char8_t,_format_handler>::writer::operator()
                  ((writer *)&local_98,pbegin,pcVar3);
        pbegin = parse_replacement_field<char8_t,fmt::v8::detail::vformat_to<char8_t>(fmt::v8::detail::buffer<char8_t>&,fmt::v8::basic_string_view<char8_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char8_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char8_t>::type>>>::type,fmt::v8::type_identity<char8_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                           (pcVar3,pend,(format_handler *)local_78);
      } while (pbegin != pend);
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}